

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

int_type __thiscall
spvutils::
HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>::
getUnbiasedNormalizedExponent
          (HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
           *this)

{
  uint_type uVar1;
  undefined4 local_20;
  undefined4 local_1c;
  uint_type significand_bits;
  int_type exp;
  HexFloat<spvutils::FloatProxy<float>,_spvutils::HexFloatTraits<spvutils::FloatProxy<float>_>_>
  *this_local;
  
  uVar1 = getBits(this);
  if ((uVar1 & 0x7fffffff) == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_1c = getUnbiasedExponent(this);
    if (local_1c == -0x7f) {
      for (local_20 = getSignificandBits(this); (local_20 & 0x400000) == 0; local_20 = local_20 << 1
          ) {
        local_1c = local_1c + -1;
      }
    }
    this_local._4_4_ = local_1c;
  }
  return this_local._4_4_;
}

Assistant:

const int_type getUnbiasedNormalizedExponent() const {
    if ((getBits() & ~sign_mask) == 0) {  // special case if everything is 0
      return 0;
    }
    int_type exp = getUnbiasedExponent();
    if (exp == min_exponent) {  // We are in denorm land.
      uint_type significand_bits = getSignificandBits();
      while ((significand_bits & (first_exponent_bit >> 1)) == 0) {
        significand_bits = static_cast<uint_type>(significand_bits << 1);
        exp = static_cast<int_type>(exp - 1);
      }
      significand_bits &= fraction_encode_mask;
    }
    return exp;
  }